

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

int Symbol_insert(symbol *data,char *key)

{
  uint uVar1;
  s_x2node *__ptr;
  char *x;
  s_x2 *psVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  s_x2node *psVar6;
  long lVar7;
  ulong uVar8;
  symbol *psVar9;
  symbol *psVar10;
  int iVar11;
  symbol **ppsVar12;
  s_x2node *psVar13;
  ulong uVar14;
  
  psVar2 = x2a;
  if (x2a != (s_x2 *)0x0) {
    uVar3 = strhash(key);
    iVar11 = psVar2->size;
    lVar7 = (long)iVar11;
    uVar14 = (long)(int)uVar3 & lVar7 - 1U;
    psVar13 = (s_x2node *)psVar2->ht;
    ppsVar12 = &psVar13->data + uVar14;
    do {
      psVar9 = *ppsVar12;
      if (psVar9 == (symbol *)0x0) {
        uVar1 = psVar2->count;
        if ((int)uVar1 < iVar11) {
          psVar6 = psVar2->tbl;
        }
        else {
          psVar6 = (s_x2node *)malloc(lVar7 * 0x50);
          if (psVar6 == (s_x2node *)0x0) {
            return 0;
          }
          psVar13 = psVar6 + lVar7 * 2;
          uVar14 = 0;
          iVar11 = (int)(lVar7 * 2);
          uVar8 = 0;
          if (0 < iVar11) {
            uVar8 = lVar7 * 2 & 0xffffffff;
          }
          for (; uVar8 != uVar14; uVar14 = uVar14 + 1) {
            (&psVar13->data)[uVar14] = (symbol *)0x0;
          }
          lVar7 = 0;
          uVar14 = 0;
          if (0 < (int)uVar1) {
            uVar14 = (ulong)uVar1;
          }
          for (; __ptr = psVar2->tbl, uVar14 << 5 != lVar7; lVar7 = lVar7 + 0x20) {
            x = *(char **)((long)&__ptr->key + lVar7);
            uVar5 = strhash(x);
            ppsVar12 = &psVar13->data + (int)(uVar5 & iVar11 - 1U);
            if (*ppsVar12 == (symbol *)0x0) {
              psVar9 = (symbol *)0x0;
            }
            else {
              (*ppsVar12)->fallback = (symbol *)((long)&psVar6->next + lVar7);
              psVar9 = *ppsVar12;
            }
            *(symbol **)((long)&psVar6->next + lVar7) = psVar9;
            *(char **)((long)&psVar6->key + lVar7) = x;
            *(undefined8 *)((long)&psVar6->data + lVar7) =
                 *(undefined8 *)((long)&__ptr->data + lVar7);
            *(symbol ***)((long)&psVar6->from + lVar7) = ppsVar12;
            *ppsVar12 = (symbol *)((long)&psVar6->data + lVar7);
          }
          free(__ptr);
          psVar2->size = iVar11;
          psVar2->tbl = psVar6;
          psVar2->ht = (s_x2node **)psVar13;
          uVar14 = (ulong)(int)(iVar11 - 1U & uVar3);
        }
        psVar2->count = uVar1 + 1;
        psVar9 = (symbol *)(psVar6 + (int)uVar1);
        psVar6[(int)uVar1].key = key;
        psVar6[(int)uVar1].data = data;
        if ((&psVar13->data)[uVar14] == (symbol *)0x0) {
          psVar10 = (symbol *)0x0;
        }
        else {
          (&psVar13->data)[uVar14]->fallback = (symbol *)&psVar9->rule;
          psVar10 = (&psVar13->data)[uVar14];
        }
        psVar9->rule = (rule *)psVar10;
        (&psVar13->data)[uVar14] = psVar9;
        psVar9->fallback = (symbol *)(psVar2->ht + uVar14);
        return 1;
      }
      iVar4 = strcmp(*(char **)&psVar9->index,key);
      ppsVar12 = (symbol **)&psVar9->rule;
    } while (iVar4 != 0);
  }
  return 0;
}

Assistant:

int Symbol_insert(struct symbol *data, const char *key)
{
  x2node *np;
  int h;
  int ph;

  if( x2a==0 ) return 0;
  ph = strhash(key);
  h = ph & (x2a->size-1);
  np = x2a->ht[h];
  while( np ){
    if( strcmp(np->key,key)==0 ){
      /* An existing entry with the same key is found. */
      /* Fail because overwrite is not allows. */
      return 0;
    }
    np = np->next;
  }
  if( x2a->count>=x2a->size ){
    /* Need to make the hash table bigger */
    int i,size;
    struct s_x2 array;
    array.size = size = x2a->size*2;
    array.count = x2a->count;
    array.tbl = (x2node*)malloc(
      (sizeof(x2node) + sizeof(x2node*))*size );
    if( array.tbl==0 ) return 0;  /* Fail due to malloc failure */
    array.ht = (x2node**)&(array.tbl[size]);
    for(i=0; i<size; i++) array.ht[i] = 0;
    for(i=0; i<x2a->count; i++){
      x2node *oldnp, *newnp;
      oldnp = &(x2a->tbl[i]);
      h = strhash(oldnp->key) & (size-1);
      newnp = &(array.tbl[i]);
      if( array.ht[h] ) array.ht[h]->from = &(newnp->next);
      newnp->next = array.ht[h];
      newnp->key = oldnp->key;
      newnp->data = oldnp->data;
      newnp->from = &(array.ht[h]);
      array.ht[h] = newnp;
    }
    free(x2a->tbl);
    *x2a = array;
  }
  /* Insert the new data */
  h = ph & (x2a->size-1);
  np = &(x2a->tbl[x2a->count++]);
  np->key = key;
  np->data = data;
  if( x2a->ht[h] ) x2a->ht[h]->from = &(np->next);
  np->next = x2a->ht[h];
  x2a->ht[h] = np;
  np->from = &(x2a->ht[h]);
  return 1;
}